

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O2

int __thiscall
cmCPackGenerator::InstallProjectViaInstallCommands
          (cmCPackGenerator *this,bool setDestDir,string *tempInstallDirectory)

{
  cmCPackLog *pcVar1;
  bool bVar2;
  char *pcVar3;
  ostream *poVar4;
  pointer pbVar5;
  int retVal;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  installCommandsVector;
  string output;
  string tmpFile;
  string tempInstallDirectoryEnv;
  char *local_410 [4];
  ostringstream cmCPackLog_msg;
  ostringstream cmCPackLog_msg_1;
  
  std::__cxx11::string::string
            ((string *)&cmCPackLog_msg,"CPACK_INSTALL_COMMANDS",(allocator *)&cmCPackLog_msg_1);
  pcVar3 = GetOption(this,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  if ((pcVar3 != (char *)0x0) && (*pcVar3 != '\0')) {
    std::__cxx11::string::string
              ((string *)&tempInstallDirectoryEnv,"CMAKE_INSTALL_PREFIX=",
               (allocator *)&cmCPackLog_msg);
    std::__cxx11::string::append((string *)&tempInstallDirectoryEnv);
    cmsys::SystemTools::PutEnv(&tempInstallDirectoryEnv);
    installCommandsVector.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    installCommandsVector.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    installCommandsVector.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&cmCPackLog_msg,pcVar3,(allocator *)&cmCPackLog_msg_1);
    cmSystemTools::ExpandListArgument((string *)&cmCPackLog_msg,&installCommandsVector,false);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    for (pbVar5 = installCommandsVector.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar5 != installCommandsVector.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar5 = pbVar5 + 1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
      poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,"Execute: ");
      poVar4 = std::operator<<(poVar4,(string *)pbVar5);
      std::endl<char,std::char_traits<char>>(poVar4);
      pcVar1 = this->Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar1,2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x122,_cmCPackLog_msg_1);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg_1);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
      output._M_dataplus._M_p = (pointer)&output.field_2;
      output._M_string_length = 0;
      output.field_2._M_local_buf[0] = '\0';
      retVal = 1;
      bVar2 = cmSystemTools::RunSingleCommand
                        ((pbVar5->_M_dataplus)._M_p,&output,&output,&retVal,(char *)0x0,
                         this->GeneratorVerbose,0.0);
      if (!bVar2 || retVal != 0) {
        std::__cxx11::string::string
                  ((string *)&cmCPackLog_msg,"CPACK_TOPLEVEL_DIRECTORY",
                   (allocator *)&cmCPackLog_msg_1);
        pcVar3 = GetOption(this,(string *)&cmCPackLog_msg);
        std::__cxx11::string::string((string *)&tmpFile,pcVar3,(allocator *)local_410);
        std::__cxx11::string::~string((string *)&cmCPackLog_msg);
        std::__cxx11::string::append((char *)&tmpFile);
        cmGeneratedFileStream::cmGeneratedFileStream
                  ((cmGeneratedFileStream *)&cmCPackLog_msg,tmpFile._M_dataplus._M_p,false);
        poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,"# Run command: ");
        poVar4 = std::operator<<(poVar4,(string *)pbVar5);
        poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
        poVar4 = std::operator<<(poVar4,"# Output:");
        poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
        poVar4 = std::operator<<(poVar4,(string *)&output);
        std::endl<char,std::char_traits<char>>(poVar4);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg_1);
        poVar4 = std::operator<<((ostream *)&cmCPackLog_msg_1,"Problem running install command: ");
        poVar4 = std::operator<<(poVar4,(string *)pbVar5);
        poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
        poVar4 = std::operator<<(poVar4,"Please check ");
        poVar4 = std::operator<<(poVar4,(string *)&tmpFile);
        poVar4 = std::operator<<(poVar4," for errors");
        std::endl<char,std::char_traits<char>>(poVar4);
        pcVar1 = this->Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(pcVar1,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x133,local_410[0]);
        std::__cxx11::string::~string((string *)local_410);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg_1);
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&cmCPackLog_msg);
        std::__cxx11::string::~string((string *)&tmpFile);
        std::__cxx11::string::~string((string *)&output);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&installCommandsVector);
        std::__cxx11::string::~string((string *)&tempInstallDirectoryEnv);
        return 0;
      }
      std::__cxx11::string::~string((string *)&output);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&installCommandsVector);
    std::__cxx11::string::~string((string *)&tempInstallDirectoryEnv);
  }
  return 1;
}

Assistant:

int cmCPackGenerator::InstallProjectViaInstallCommands(
  bool setDestDir, const std::string& tempInstallDirectory)
{
  (void) setDestDir;
  const char* installCommands = this->GetOption("CPACK_INSTALL_COMMANDS");
  if ( installCommands && *installCommands )
    {
    std::string tempInstallDirectoryEnv = "CMAKE_INSTALL_PREFIX=";
    tempInstallDirectoryEnv += tempInstallDirectory;
    cmSystemTools::PutEnv(tempInstallDirectoryEnv);
    std::vector<std::string> installCommandsVector;
    cmSystemTools::ExpandListArgument(installCommands,installCommandsVector);
    std::vector<std::string>::iterator it;
    for ( it = installCommandsVector.begin();
      it != installCommandsVector.end();
      ++it )
      {
      cmCPackLogger(cmCPackLog::LOG_VERBOSE, "Execute: " << *it
        << std::endl);
      std::string output;
      int retVal = 1;
      bool resB = cmSystemTools::RunSingleCommand(
        it->c_str(), &output, &output,
        &retVal, 0, this->GeneratorVerbose, 0);
      if ( !resB || retVal )
        {
        std::string tmpFile = this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
        tmpFile += "/InstallOutput.log";
        cmGeneratedFileStream ofs(tmpFile.c_str());
        ofs << "# Run command: " << *it << std::endl
          << "# Output:" << std::endl
          << output << std::endl;
        cmCPackLogger(cmCPackLog::LOG_ERROR,
          "Problem running install command: " << *it << std::endl
          << "Please check " << tmpFile << " for errors"
          << std::endl);
        return 0;
        }
      }
    }
  return 1;
}